

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

ostream * __thiscall
trompeloeil::
call_matcher<int_&(int_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>_>_>
::report_mismatch(call_matcher<int_&(int_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>_>_>
                  *this,ostream *os,call_params_type_t<int_&(int_&)> *params)

{
  list_elem<trompeloeil::condition_base<int_&(int_&)>_> *plVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  condition_base<int_&(int_&)> *cond;
  
  this->reported = true;
  (*(this->super_call_matcher_base<int_&(int_&)>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>._vptr_list_elem[6])();
  if (*(params->super__Tuple_impl<0UL,_int_&>).super__Head_base<0UL,_int_&,_false>._M_head_impl ==
      (this->val).
      super__Tuple_impl<0UL,_trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>_>
      .
      super__Head_base<0UL,_trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>,_false>
      ._M_head_impl.value.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
     ) {
    plVar1 = &(this->conditions).super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>;
    while (plVar1 = plVar1->next,
          plVar1 != &(this->conditions).super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>)
    {
      iVar2 = (*plVar1->_vptr_list_elem[2])(plVar1,params);
      if ((char)iVar2 == '\0') {
        poVar3 = std::operator<<(os,"\n  Failed WITH(");
        iVar2 = (*plVar1->_vptr_list_elem[3])(plVar1);
        poVar3 = std::operator<<(poVar3,(char *)CONCAT44(extraout_var,iVar2));
        std::operator<<(poVar3,')');
      }
    }
  }
  else {
    std::operator<<(os,'\n');
    print_mismatch<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<int&>,int>,int&,0ul>
              (os,&this->val,params);
  }
  return os;
}

Assistant:

std::ostream&
    report_mismatch(
      std::ostream& os,
      call_params_type_t<Sig> const & params)
    override
    {
      reported = true;
      report_signature(os);
      if (match_parameters(val, params))
      {
        for (auto& cond : conditions)
        {
          if (!cond.check(params))
          {
            os << "\n  Failed WITH(" << cond.name() << ')';
          }
        }
      }
      else
      {
        os << '\n';
        ::trompeloeil::print_mismatch(os, val, params);
      }
      return os;
    }